

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O1

int mg_session_read_record_message(mg_session *session,mg_message_record **message)

{
  int iVar1;
  mg_list *in_RAX;
  mg_message_record *pmVar2;
  mg_list *fields;
  mg_message_record local_18;
  
  local_18.fields = in_RAX;
  iVar1 = mg_session_read_list(session,&local_18.fields);
  if (iVar1 == 0) {
    pmVar2 = (mg_message_record *)mg_allocator_malloc(session->decoder_allocator,8);
    if (pmVar2 == (mg_message_record *)0x0) {
      mg_session_set_error(session,"out of memory");
      mg_list_destroy(local_18.fields);
      iVar1 = -3;
    }
    else {
      pmVar2->fields = local_18.fields;
      *message = pmVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_record_message(mg_session *session,
                                   mg_message_record **message) {
  mg_list *fields;
  MG_RETURN_IF_FAILED(mg_session_read_list(session, &fields));

  mg_message_record *tmessage = mg_allocator_malloc(session->decoder_allocator,
                                                    sizeof(mg_message_record));
  if (!tmessage) {
    mg_session_set_error(session, "out of memory");
    mg_list_destroy(fields);
    return MG_ERROR_OOM;
  }
  tmessage->fields = fields;
  *message = tmessage;
  return 0;
}